

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

Slice leveldb::GetLengthPrefixedSlice(char *data)

{
  Slice SVar1;
  uint32_t len;
  uint32_t local_c;
  
  SVar1.data_ = GetVarint32Ptr(data,data + 5,&local_c);
  SVar1.size_._0_4_ = local_c;
  SVar1.size_._4_4_ = 0;
  return SVar1;
}

Assistant:

static Slice GetLengthPrefixedSlice(const char* data) {
  uint32_t len;
  const char* p = data;
  p = GetVarint32Ptr(p, p + 5, &len);  // +5: we assume "p" is not corrupted
  return Slice(p, len);
}